

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O2

ostream * cppqc::printInput<Rectangle>(ostream *out,tuple<Rectangle> *in)

{
  ostream *poVar1;
  Rectangle *x;
  string sStack_38;
  
  poVar1 = std::operator<<(out,"  0: ");
  PrettyPrint<Rectangle>::toString_abi_cxx11_(&sStack_38,(PrettyPrint<Rectangle> *)in,x);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,'\n');
  poVar1 = (ostream *)std::ostream::flush();
  std::__cxx11::string::~string((string *)&sStack_38);
  return poVar1;
}

Assistant:

std::ostream& printInput(std::ostream& out, const std::tuple<T0>& in) {
  return out << "  0: " << prettyPrint(std::get<0>(in)) << '\n' << std::flush;
}